

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

bool CoreML::hasCategoricalSequences(Model *model)

{
  int iVar1;
  ModelDescription *pMVar2;
  Type *pTVar3;
  SequenceFeatureType *pSVar4;
  int i;
  int iVar5;
  FeatureType *pFVar6;
  ModelDescription *pMVar7;
  
  iVar5 = 0;
  while( true ) {
    pMVar7 = model->description_;
    pMVar2 = pMVar7;
    if (pMVar7 == (ModelDescription *)0x0) {
      pMVar2 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
    }
    if ((pMVar2->input_).super_RepeatedPtrFieldBase.current_size_ <= iVar5) break;
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&(pMVar2->input_).super_RepeatedPtrFieldBase,iVar5);
    pFVar6 = pTVar3->type_;
    if (pFVar6 == (FeatureType *)0x0) {
      pFVar6 = (FeatureType *)&Specification::_FeatureType_default_instance_;
    }
    if ((pFVar6->_oneof_case_[0] == 7) &&
       (pSVar4 = Specification::FeatureType::sequencetype(pFVar6),
       (pSVar4->_oneof_case_[0] - 1 & 0xfffffffd) == 0)) {
      return true;
    }
    iVar5 = iVar5 + 1;
  }
  iVar5 = 0;
  while( true ) {
    if (pMVar7 == (ModelDescription *)0x0) {
      pMVar7 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
    }
    iVar1 = (pMVar7->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 <= iVar5) {
      return iVar5 < iVar1;
    }
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&(pMVar7->output_).super_RepeatedPtrFieldBase,iVar5);
    pFVar6 = pTVar3->type_;
    if (pFVar6 == (FeatureType *)0x0) {
      pFVar6 = (FeatureType *)&Specification::_FeatureType_default_instance_;
    }
    if ((pFVar6->_oneof_case_[0] == 7) &&
       (pSVar4 = Specification::FeatureType::sequencetype(pFVar6),
       (pSVar4->_oneof_case_[0] - 1 & 0xfffffffd) == 0)) break;
    iVar5 = iVar5 + 1;
    pMVar7 = model->description_;
  }
  return iVar5 < iVar1;
}

Assistant:

bool CoreML::hasCategoricalSequences(const Specification::Model& model) {

    for (int i=0; i<model.description().input_size(); i++) {
        auto &feature = model.description().input(i);
        if (feature.type().Type_case() == Specification::FeatureType::kSequenceType) {
            switch (feature.type().sequencetype().Type_case()) {
                case Specification::SequenceFeatureType::kStringType:
                case Specification::SequenceFeatureType::kInt64Type:
                    return true;
                default:
                    break;
            }
        }
    }

    for (int i=0; i<model.description().output_size(); i++) {
        auto &feature = model.description().output(i);
        if (feature.type().Type_case() == Specification::FeatureType::kSequenceType) {
            switch (feature.type().sequencetype().Type_case()) {
                case Specification::SequenceFeatureType::kStringType:
                case Specification::SequenceFeatureType::kInt64Type:
                    return true;
                default:
                    break;
            }
        }
    }

    return false;
}